

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.h
# Opt level: O0

cmCommand * __thiscall cmBuildCommand::Clone(cmBuildCommand *this)

{
  cmCommand *this_00;
  cmBuildCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmBuildCommand((cmBuildCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmBuildCommand; }